

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_fill(lua_State *L)

{
  uint uVar1;
  void *__s;
  long in_RDI;
  int32_t fill;
  CTSize len;
  void *dp;
  undefined4 local_18;
  
  __s = ffi_checkptr(_fill,(int)((ulong)in_RDI >> 0x20),(CTypeID)in_RDI);
  uVar1 = ffi_checkint(_fill,(int)((ulong)in_RDI >> 0x20));
  local_18 = 0;
  if ((*(long *)(in_RDI + 0x10) + 0x10U < *(ulong *)(in_RDI + 0x18)) &&
     (*(int *)(*(long *)(in_RDI + 0x10) + 0x14) != -1)) {
    local_18 = ffi_checkint(_fill,(int)((ulong)in_RDI >> 0x20));
  }
  memset(__s,local_18 & 0xff,(ulong)uVar1);
  return 0;
}

Assistant:

LJLIB_CF(ffi_fill)	LJLIB_REC(.)
{
  void *dp = ffi_checkptr(L, 1, CTID_P_VOID);
  CTSize len = (CTSize)ffi_checkint(L, 2);
  int32_t fill = 0;
  if (L->base+2 < L->top && !tvisnil(L->base+2)) fill = ffi_checkint(L, 3);
  memset(dp, fill, len);
  return 0;
}